

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

query_t * queryDatabase(int thread_index,int query_id,char *sql_command)

{
  FILE *__stream;
  int iVar1;
  undefined8 uVar2;
  size_t sVar3;
  int local_3c;
  undefined8 uStack_38;
  int rc;
  char *err_msg;
  sqlite3 *db;
  query_t *query;
  char *sql_command_local;
  int query_id_local;
  int thread_index_local;
  
  query = (query_t *)sql_command;
  sql_command_local._0_4_ = query_id;
  sql_command_local._4_4_ = thread_index;
  db = (sqlite3 *)malloc(0x10);
  uStack_38 = 0;
  iVar1 = sqlite3_open(DATABASE,&err_msg);
  __stream = _stderr;
  if (iVar1 == 0) {
    if ((int)sql_command_local == 0) {
      local_3c = sqlite3_exec(err_msg,query,viewCallback,0,&stack0xffffffffffffffc8);
    }
    else if ((int)sql_command_local == 1) {
      local_3c = sqlite3_exec(err_msg,query,busy_roomsCallback,0,&stack0xffffffffffffffc8);
    }
    else if ((int)sql_command_local == 2) {
      local_3c = sqlite3_exec(err_msg,query,validEntryCallback,0,&stack0xffffffffffffffc8);
    }
    else {
      local_3c = 0;
    }
    printf("Thread #%d: Querying from database:\n   %s\n",(ulong)sql_command_local._4_4_,query);
    if (local_3c == 0) {
      sqlite3_close(err_msg);
      if ((int)sql_command_local == 0) {
        sVar3 = strlen(query_result_g);
        *(undefined1 *)(sVar3 + 0x10940f) = 0;
        *(undefined4 *)db = 0;
        *(char **)(db + 8) = query_result_g;
      }
      else if ((int)sql_command_local == 1) {
        *(undefined4 *)db = 0;
        *(char **)(db + 8) = rooms_busy_g;
      }
      else if ((int)sql_command_local == 2) {
        *(undefined4 *)db = 0;
        *(int **)(db + 8) = &entry_id_g;
      }
      _query_id_local = (query_t *)db;
    }
    else {
      fprintf(_stderr,"Failed to select data\n");
      fprintf(_stderr,"SQL error: %s\n",uStack_38);
      sqlite3_free(uStack_38);
      sqlite3_close(err_msg);
      *(undefined4 *)db = 0xffffffff;
      *(char **)(db + 8) = "";
      _query_id_local = (query_t *)db;
    }
  }
  else {
    uVar2 = sqlite3_errmsg(err_msg);
    fprintf(__stream,"Cannot open database:\n%s\n",uVar2);
    sqlite3_close(err_msg);
    *(undefined4 *)db = 0xffffffff;
    *(char **)(db + 8) = "";
    _query_id_local = (query_t *)db;
  }
  return _query_id_local;
}

Assistant:

query_t* 
queryDatabase(int thread_index, const int query_id, const char* sql_command) 
{
    
    query_t* query = (query_t*) malloc(sizeof(query_t)); // variable to be returned + its initialization


    sqlite3* db;
    char* err_msg = 0;
    
    int rc = sqlite3_open(DATABASE, &db);

    
    if (rc != SQLITE_OK) {
        fprintf(stderr, "Cannot open database:\n%s\n", sqlite3_errmsg(db));
        sqlite3_close(db);
        
        query->rv = -1;
        query->query_result = (void*)"";
        return query;
    }
    


    switch (query_id){
        case 0:
            rc = sqlite3_exec(db, sql_command, viewCallback, 0, &err_msg);
            break;
        
        case 1:
            rc = sqlite3_exec(db, sql_command, busy_roomsCallback, 0, &err_msg);
            break;

        case 2:
            rc = sqlite3_exec(db, sql_command, validEntryCallback, 0, &err_msg); 
            break;
    }

    #if VERBOSE_DEBUG
        printf("Thread #%d: Querying from database:\n   %s\n", thread_index, sql_command);
    #endif


    if (rc != SQLITE_OK ) {
        fprintf(stderr, "Failed to select data\n");
        fprintf(stderr, "SQL error: %s\n", err_msg);

        sqlite3_free(err_msg);
        sqlite3_close(db);
        
        query->rv = -1;
        query->query_result = (void*)"";
        return query;
    } 

    sqlite3_close(db);


    // based on the query return the appropriate variable
    

    switch (query_id){
        case 0:

            // removing new line from last entry in list of entries (`view` response)
            query_result_g[strlen(query_result_g)-1] = '\0';

            query->rv = 0;
            query->query_result = (void*) query_result_g;
            break;
        
        case 1:
            query->rv = 0;
            query->query_result = (void*) rooms_busy_g;
            break;
        
        case 2:
            query->rv = 0;
            query->query_result = (void*) &entry_id_g;
            break;
    }

    return query;
}